

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error t1_set_mm_blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint uVar1;
  uint uVar2;
  PS_Blend pPVar3;
  FT_Fixed *pFVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  pPVar3 = face->blend;
  if (pPVar3 == (PS_Blend)0x0) {
    return 6;
  }
  uVar1 = pPVar3->num_designs;
  if ((ulong)uVar1 == 0) {
    iVar6 = -1;
  }
  else {
    uVar2 = pPVar3->num_axis;
    pFVar4 = pPVar3->weight_vector;
    uVar8 = 0;
    bVar5 = false;
    do {
      lVar9 = 0x10000;
      if ((ulong)uVar2 != 0) {
        uVar10 = 0;
        do {
          if (uVar10 < num_coords) {
            lVar7 = 0x10000 - coords[uVar10];
            if (((uint)uVar8 >> ((uint)uVar10 & 0x1f) & 1) != 0) {
              lVar7 = coords[uVar10];
            }
            if (lVar7 < 1) {
              lVar9 = 0;
              break;
            }
            if (lVar7 < 0x10000) {
              lVar9 = (int)lVar7 * lVar9;
              lVar9 = (long)(int)((ulong)((lVar9 >> 0x3f) + lVar9 + 0x8000) >> 0x10);
            }
          }
          else {
            lVar9 = lVar9 >> 1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
      if (pFVar4[uVar8] != lVar9) {
        pFVar4[uVar8] = lVar9;
        bVar5 = true;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
    iVar6 = -(uint)!bVar5;
  }
  return iVar6;
}

Assistant:

static FT_Error
  t1_set_mm_blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   n, m;

    FT_Bool  have_diff = 0;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* recompute the weight vector from the blend coordinates */
    for ( n = 0; n < blend->num_designs; n++ )
    {
      FT_Fixed  result = 0x10000L;  /* 1.0 fixed */
      FT_Fixed  factor;


      for ( m = 0; m < blend->num_axis; m++ )
      {
        /* use a default value if we don't have a coordinate */
        if ( m >= num_coords )
        {
          result >>= 1;
          continue;
        }

        /* get current blend axis position */
        factor = coords[m];
        if ( ( n & ( 1 << m ) ) == 0 )
          factor = 0x10000L - factor;

        if ( factor <= 0 )
        {
          result = 0;
          break;
        }
        else if ( factor >= 0x10000L )
          continue;

        result = FT_MulFix( result, factor );
      }

      if ( blend->weight_vector[n] != result )
      {
        blend->weight_vector[n] = result;
        have_diff               = 1;
      }
    }

    /* return value -1 indicates `no change' */
    return have_diff ? FT_Err_Ok : -1;
  }